

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O1

void Fra_ClassesSelectRepr(Fra_Cla_t *p)

{
  long *plVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  Aig_Obj_t *pObj;
  long lVar8;
  ulong uVar9;
  int iVar10;
  
  pVVar3 = p->vClasses;
  if (0 < pVVar3->nSize) {
    lVar6 = 0;
    do {
      plVar1 = (long *)pVVar3->pArray[lVar6];
      pObj = (Aig_Obj_t *)*plVar1;
      uVar9 = 0xffffffff;
      iVar2 = -1;
      if (pObj == (Aig_Obj_t *)0x0) {
        lVar8 = 0;
      }
      else {
        iVar10 = 1000000000;
        uVar7 = 0;
        lVar8 = 0;
        do {
          iVar2 = Aig_SupportSize(p->pAig,pObj);
          if ((iVar2 < iVar10) ||
             ((iVar10 == iVar2 &&
              ((*(uint *)(plVar1[uVar7] + 0x1c) & 0xffffff) < (*(uint *)(lVar8 + 0x1c) & 0xffffff)))
             )) {
            lVar8 = plVar1[uVar7];
            uVar9 = uVar7 & 0xffffffff;
            iVar10 = iVar2;
          }
          iVar2 = (int)uVar9;
          pObj = (Aig_Obj_t *)plVar1[uVar7 + 1];
          uVar7 = uVar7 + 1;
        } while (pObj != (Aig_Obj_t *)0x0);
      }
      if (iVar2 != 0) {
        plVar1[iVar2] = *plVar1;
        *plVar1 = lVar8;
        if (lVar8 != 0) {
          lVar4 = 1;
          do {
            if (lVar4 == 1) {
              lVar5 = 0;
            }
            else {
              lVar5 = *plVar1;
            }
            *(long *)(*(long *)(*(long *)(*(long *)(lVar8 + 0x28) + 0x30) + 8) +
                     (long)*(int *)(lVar8 + 0x24) * 8) = lVar5;
            lVar8 = plVar1[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar8 != 0);
        }
      }
      lVar6 = lVar6 + 1;
      pVVar3 = p->vClasses;
    } while (lVar6 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Fra_ClassesSelectRepr( Fra_Cla_t * p )
{
    Aig_Obj_t ** pClass, * pNodeMin;
    int i, c, cMinSupp, nSuppSizeMin, nSuppSizeCur;
    // reassign representatives in each class
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        // collect support sizes and find the min-support node
        cMinSupp = -1;
        pNodeMin = NULL;
        nSuppSizeMin = ABC_INFINITY;
        for ( c = 0; pClass[c]; c++ )
        {
            nSuppSizeCur = Aig_SupportSize( p->pAig, pClass[c] );
//            nSuppSizeCur = 1;
            if ( nSuppSizeMin > nSuppSizeCur || 
                (nSuppSizeMin == nSuppSizeCur && pNodeMin->Level > pClass[c]->Level) )
            {
                nSuppSizeMin = nSuppSizeCur;
                pNodeMin = pClass[c];
                cMinSupp = c; 
            }
        }
        // skip the case when the repr did not change
        if ( cMinSupp == 0 )
            continue;
        // make the new node the representative of the class
        pClass[cMinSupp] = pClass[0];
        pClass[0] = pNodeMin;
        // set the representative
        for ( c = 0; pClass[c]; c++ )
            Fra_ClassObjSetRepr( pClass[c], c? pClass[0] : NULL );
    }
}